

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

void nng_device_aio(nng_aio *aio,nng_socket s1,nng_socket s2)

{
  nng_err result;
  nni_sock *s2_00;
  nni_sock *local_30;
  nni_sock *sock2;
  nni_sock *sock1;
  
  sock2 = (nni_sock *)0x0;
  local_30 = (nni_sock *)0x0;
  nni_aio_reset(aio);
  if ((s1.id - 1 < 0xfffffffe) && (result = nni_sock_find(&sock2,s1.id), result != NNG_OK)) {
LAB_0010cc95:
    nni_aio_finish_error(aio,result);
  }
  else {
    if (s2.id == s1.id || s2.id + 1 < 2) {
      s2_00 = (nni_sock *)0x0;
    }
    else {
      result = nni_sock_find(&local_30,s2.id);
      s2_00 = local_30;
      if (result != NNG_OK) {
        nni_sock_rele(sock2);
        goto LAB_0010cc95;
      }
    }
    nni_device(aio,sock2,s2_00);
    if (sock2 != (nni_sock *)0x0) {
      nni_sock_rele(sock2);
    }
    if (local_30 != (nni_sock *)0x0) {
      nni_sock_rele(local_30);
    }
  }
  return;
}

Assistant:

void
nng_device_aio(nng_aio *aio, nng_socket s1, nng_socket s2)
{
	int       rv;
	nni_sock *sock1 = NULL;
	nni_sock *sock2 = NULL;

	nni_aio_reset(aio);
	if ((s1.id > 0) && (s1.id != (uint32_t) -1)) {
		if ((rv = nni_sock_find(&sock1, s1.id)) != 0) {
			nni_aio_finish_error(aio, rv);
			return;
		}
	}
	if (((s2.id > 0) && (s2.id != (uint32_t) -1)) && (s2.id != s1.id)) {
		if ((rv = nni_sock_find(&sock2, s2.id)) != 0) {
			nni_sock_rele(sock1);
			nni_aio_finish_error(aio, rv);
			return;
		}
	}

	nni_device(aio, sock1, sock2);
	if (sock1 != NULL) {
		nni_sock_rele(sock1);
	}
	if (sock2 != NULL) {
		nni_sock_rele(sock2);
	}
}